

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O2

long cm_zlib_inflateMark(z_streamp strm)

{
  internal_state *piVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  
  iVar2 = inflateStateCheck(strm);
  lVar3 = -0x10000;
  if (iVar2 == 0) {
    piVar1 = strm->state;
    if (piVar1->status == 0x3f4c) {
      uVar4 = (int)piVar1[1].dyn_ltree[0xf7] - *(int *)&piVar1->field_0x5c;
    }
    else {
      uVar4 = 0;
      if (piVar1->status == 0x3f43) {
        uVar4 = *(uint *)&piVar1->field_0x5c;
      }
    }
    lVar3 = (long)(int)piVar1[1].dyn_ltree[0xf6] * 0x10000 + (ulong)uVar4;
  }
  return lVar3;
}

Assistant:

long ZEXPORT inflateMark(z_streamp strm) {
    struct inflate_state FAR *state;

    if (inflateStateCheck(strm))
        return -(1L << 16);
    state = (struct inflate_state FAR *)strm->state;
    return (long)(((unsigned long)((long)state->back)) << 16) +
        (state->mode == COPY ? state->length :
            (state->mode == MATCH ? state->was - state->length : 0));
}